

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void_t<typename_unique_ptr<Person>::element_type>
mserialize::detail::BuiltinDeserializer<std::unique_ptr<Person,std::default_delete<Person>>,void>::
make_nonempty<std::unique_ptr<Person,std::default_delete<Person>>>
          (unique_ptr<Person,_std::default_delete<Person>_> *ptr)

{
  pointer __p;
  
  __p = (pointer)operator_new(0x28);
  __p->age = 0;
  (__p->name)._M_dataplus._M_p = (pointer)&(__p->name).field_2;
  (__p->name)._M_string_length = 0;
  (__p->name).field_2._M_local_buf[0] = '\0';
  std::__uniq_ptr_impl<Person,_std::default_delete<Person>_>::reset
            ((__uniq_ptr_impl<Person,_std::default_delete<Person>_> *)ptr,__p);
  return;
}

Assistant:

static void_t<typename SmartPtr::element_type> make_nonempty(SmartPtr& ptr)
  {
    using T = typename SmartPtr::element_type;
    ptr.reset(new T{}); // NOLINT(cppcoreguidelines-owning-memory)
  }